

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QByteArray * parseTzPosixRule(QByteArray *__return_storage_ptr__,QDataStream *ds)

{
  Status SVar1;
  long in_FS_OFFSET;
  quint8 ch;
  qint8 local_21;
  QByteArray *local_20;
  
  local_20 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_21 = -0x56;
  QDataStream::operator>>(ds,&local_21);
  if (local_21 == '\n') {
    SVar1 = QDataStream::status(ds);
    if (SVar1 == Ok) {
      QDataStream::operator>>(ds,&local_21);
      while (local_21 != '\n') {
        SVar1 = QDataStream::status(ds);
        if (SVar1 != Ok) break;
        QByteArray::append(__return_storage_ptr__,local_21);
        QDataStream::operator>>(ds,&local_21);
      }
    }
  }
  if (*(QByteArray **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(QByteArray **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray parseTzPosixRule(QDataStream &ds)
{
    // Parse POSIX rule, variable length '\n' enclosed
    QByteArray rule;

    quint8 ch;
    ds >> ch;
    if (ch != '\n' || ds.status() != QDataStream::Ok)
        return rule;
    ds >> ch;
    while (ch != '\n' && ds.status() == QDataStream::Ok) {
        rule.append((char)ch);
        ds >> ch;
    }

    return rule;
}